

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.h
# Opt level: O2

size_t GetDataSize<SignerInfo>(vector<SignerInfo,_std::allocator<SignerInfo>_> *in)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = 0;
  uVar1 = 0;
  while( true ) {
    if ((ulong)((*(long *)(in + 8) - *(long *)in) / 0x1a8) <= (ulong)uVar1) break;
    sVar2 = DerBase::EncodedSize((DerBase *)(*(long *)in + (ulong)uVar1 * 0x1a8));
    sVar3 = sVar3 + sVar2;
    uVar1 = uVar1 + 1;
  }
  return sVar3;
}

Assistant:

size_t GetDataSize(std::vector<T>& in) 
{
	size_t ret = 0;
	for (unsigned int i = 0; i < in.size(); ++i)
	{
		ret += in[i].EncodedSize();
	}

	return ret;
}